

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O1

void print_package_name(int index)

{
  uint uVar1;
  DLword *pDVar2;
  LispPTR LVar3;
  DLword *char1;
  ulong uVar4;
  char *__format;
  ulong uVar5;
  DLword length;
  
  if (index == 0) {
    __format = "#:";
  }
  else {
    LVar3 = aref1(*Package_from_Index_word,index);
    if ((LVar3 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar3);
    }
    uVar4 = (ulong)*(uint *)(Lisp_world + (ulong)LVar3 + 4);
    if ((*(uint *)(Lisp_world + (ulong)LVar3 + 4) & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar4);
    }
    pDVar2 = Lisp_world;
    uVar1 = *(uint *)(Lisp_world + uVar4);
    char1 = Lisp_world + (uVar1 & 0xfffffff);
    uVar5 = (ulong)Lisp_world[uVar4 + 2];
    if (uVar5 != 0) {
      char1 = (DLword *)((long)char1 + uVar5);
      puts("OFFSET:");
    }
    length = pDVar2[uVar4 + 4];
    LVar3 = compare_chars((char *)char1,"INTERLISP",length);
    if (LVar3 == 1) {
      __format = "IL:";
    }
    else {
      LVar3 = compare_chars((char *)char1,"LISP",length);
      if (LVar3 == 1) {
        __format = "CL:";
      }
      else {
        LVar3 = compare_chars((char *)char1,"XEROX-COMMON-LISP",length);
        if (LVar3 == 1) {
          __format = "XCL:";
        }
        else {
          LVar3 = compare_chars((char *)char1,"SYSTEM",length);
          if (LVar3 != 1) {
            LVar3 = compare_chars((char *)char1,"KEYWORD",length);
            if (LVar3 != 1) {
              LVar3 = compare_chars((char *)char1,"COMPILER",length);
              if (LVar3 == 1) {
                __format = "XCLC:";
                goto LAB_00132eed;
              }
              if (length != 0) {
                uVar4 = (long)pDVar2 + uVar5 + (ulong)(uVar1 & 0xfffffff) * 2;
                do {
                  putchar((uint)*(byte *)(uVar4 ^ 3));
                  uVar4 = uVar4 + 1;
                  length = length - 1;
                } while (length != 0);
              }
            }
            putchar(0x3a);
            return;
          }
          __format = "SI:";
        }
      }
    }
  }
LAB_00132eed:
  printf(__format);
  return;
}

Assistant:

void print_package_name(int index) {
  PACKAGE *package;
  NEWSTRINGP *namestring;
  DLword len;
  char *pname;

  if (index == 0) {
    printf("#:");
    return;
  }
  package = (PACKAGE *)NativeAligned4FromLAddr(aref1(*Package_from_Index_word, index));
  namestring = (NEWSTRINGP *)NativeAligned4FromLAddr(package->NAME);
  pname = (char *)NativeAligned2FromLAddr(namestring->base);
  if (namestring->offset != 0) {
    pname += namestring->offset;
    printf("OFFSET:\n");
  }
  len = (DLword)(namestring->fillpointer);

  if (compare_chars(pname, "INTERLISP", len) == T) {
    printf("IL:");
    return;
  } else if (compare_chars(pname, "LISP", len) == T) {
    printf("CL:");
    return;
  } else if (compare_chars(pname, "XEROX-COMMON-LISP", len) == T) {
    printf("XCL:");
    return;
  } else if (compare_chars(pname, "SYSTEM", len) == T) {
    printf("SI:");
    return;
  } else if (compare_chars(pname, "KEYWORD", len) == T) {
    printf(":");
    return;
  } else if (compare_chars(pname, "COMPILER", len) == T) {
    printf("XCLC:");
    return;
  } else {
    while (len > 0) {
      putchar(GETBYTE(pname++));
      len--;
    }
    putchar(':');
    return;
  }

}